

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O2

void If_ManComputeRequired(If_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  If_Par_t *pIVar3;
  uint *puVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  If_Obj_t *pIVar8;
  If_Man_t *pIVar9;
  Tim_Man_t *p_01;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  If_ManMarkMapping(p);
  if (p->pManTim == (Tim_Man_t *)0x0) {
    if ((p->pPars->pTimesReq == (float *)0x0) || (p->pPars->fAreaOnly != 0)) {
      pIVar9 = p;
      fVar11 = If_ManDelayMax(p,0);
      p->RequiredGlo = fVar11;
      pIVar3 = p->pPars;
      if ((pIVar3->nRelaxRatio != 0) &&
         ((pIVar3->DelayTargetNew == 0.0 && (!NAN(pIVar3->DelayTargetNew))))) {
        pIVar3->DelayTargetNew = (((float)pIVar3->nRelaxRatio + 100.0) * fVar11) / 100.0;
      }
      fVar13 = pIVar3->DelayTarget;
      if ((fVar13 != -1.0) || (NAN(fVar13))) {
        if (fVar11 <= fVar13 + p->fEpsilon) {
          if (fVar11 < fVar13 - p->fEpsilon) {
            if (p->fNextRound == 0) {
              p->fNextRound = 1;
            }
            p->RequiredGlo = fVar13;
          }
        }
        else if (p->fNextRound == 0) {
          p->fNextRound = 1;
          Abc_Print((int)pIVar9,
                    "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                    (double)fVar13);
          pIVar3 = p->pPars;
        }
      }
      else if (0.0 < pIVar3->DelayTargetNew) {
        p->RequiredGlo = pIVar3->DelayTargetNew;
      }
      if (pIVar3->fAreaOnly != 0) {
        return;
      }
      if (pIVar3->fDoAverage == 0) {
        if (pIVar3->fLatchPaths == 0) {
          for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
            pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
            *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x34) = p->RequiredGlo;
          }
        }
        else {
          for (iVar6 = p->nObjs[3] - pIVar3->nLatchesCo; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1)
          {
            pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
            *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x34) = p->RequiredGlo;
          }
        }
      }
      else if (pIVar3->nRelaxRatio == 0) {
        for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
          pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
          *(undefined4 *)(*(long *)((long)pvVar2 + 0x18) + 0x34) =
               *(undefined4 *)(*(long *)((long)pvVar2 + 0x18) + 0x5c);
        }
      }
      else {
        for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
          pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
          *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x34) =
               (((float)p->pPars->nRelaxRatio + 100.0) *
               *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x5c)) / 100.0;
        }
      }
    }
    else {
      uVar7 = 0;
      for (lVar10 = 0; p_00 = p->vCos, lVar10 < p_00->nSize; lVar10 = lVar10 + 1) {
        pvVar2 = Vec_PtrEntry(p_00,(int)lVar10);
        fVar11 = *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x5c);
        fVar13 = p->pPars->pTimesReq[lVar10];
        fVar14 = p->fEpsilon + fVar13;
        fVar12 = fVar11;
        if (fVar11 <= fVar14) {
          fVar12 = fVar13;
        }
        uVar7 = uVar7 + (fVar14 < fVar11);
        *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x34) = fVar12;
      }
      if ((uVar7 != 0) && (p->fReqTimeWarn == 0)) {
        pcVar5 = "s";
        if (uVar7 == 1) {
          pcVar5 = "";
        }
        Abc_Print((int)p_00,
                  "Required times are exceeded at %d output%s. The earliest arrival times are used.\n"
                  ,(ulong)uVar7,pcVar5);
        p->fReqTimeWarn = 1;
      }
    }
    for (uVar7 = 0; (int)uVar7 < p->vObjsRev->nSize; uVar7 = uVar7 + 1) {
      pIVar8 = (If_Obj_t *)(ulong)uVar7;
      pvVar2 = Vec_PtrEntry(p->vObjsRev,uVar7);
      if (*(int *)((long)pvVar2 + 0xc) != 0) {
        If_CutPropagateRequired
                  (p,pIVar8,(If_Cut_t *)((long)pvVar2 + 0x50),*(float *)((long)pvVar2 + 0x34));
      }
    }
  }
  else {
    pIVar9 = p;
    fVar11 = If_ManDelayMax(p,0);
    p->RequiredGlo = fVar11;
    pIVar3 = p->pPars;
    if (((pIVar3->nRelaxRatio != 0) && (pIVar3->DelayTargetNew == 0.0)) &&
       (!NAN(pIVar3->DelayTargetNew))) {
      pIVar3->DelayTargetNew = (((float)pIVar3->nRelaxRatio + 100.0) * fVar11) / 100.0;
    }
    fVar13 = pIVar3->DelayTarget;
    if ((fVar13 != -1.0) || (NAN(fVar13))) {
      if (fVar11 <= fVar13 + p->fEpsilon) {
        if (fVar11 < fVar13 - p->fEpsilon) {
          if (p->fNextRound == 0) {
            p->fNextRound = 1;
          }
          p->RequiredGlo = fVar13;
        }
      }
      else if (p->fNextRound == 0) {
        p->fNextRound = 1;
        Abc_Print((int)pIVar9,
                  "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n",
                  (double)fVar13);
        pIVar3 = p->pPars;
      }
    }
    else if (0.0 < pIVar3->DelayTargetNew) {
      p->RequiredGlo = pIVar3->DelayTargetNew;
    }
    if (pIVar3->fAreaOnly == 0) {
      Tim_ManIncrementTravId(p->pManTim);
      if (p->vCoAttrs == (Vec_Int_t *)0x0) {
        pIVar3 = p->pPars;
        if (pIVar3->fDoAverage == 0) {
          if (pIVar3->fLatchPaths == 0) {
            Tim_ManInitPoRequiredAll(p->pManTim,p->RequiredGlo);
          }
          else {
            for (iVar6 = pIVar3->nLatchesCoBox; iVar1 = p->nObjs[3] - pIVar3->nLatchesCo,
                iVar6 < iVar1; iVar6 = iVar6 + 1) {
              Vec_PtrEntry(p->vCos,iVar6);
              Tim_ManSetCoRequired(p->pManTim,iVar6,1e+20);
              pIVar3 = p->pPars;
            }
            for (; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
              Vec_PtrEntry(p->vCos,iVar1);
              Tim_ManSetCoRequired(p->pManTim,iVar1,p->RequiredGlo);
            }
          }
        }
        else if (pIVar3->nRelaxRatio == 0) {
          for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
            pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
            Tim_ManSetCoRequired(p->pManTim,iVar6,*(float *)(*(long *)((long)pvVar2 + 0x18) + 0x5c))
            ;
          }
        }
        else {
          for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
            pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
            Tim_ManSetCoRequired
                      (p->pManTim,iVar6,
                       (((float)p->pPars->nRelaxRatio + 100.0) *
                       *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x5c)) / 100.0);
          }
        }
      }
      else {
        if (p->nObjs[3] != p->vCoAttrs->nSize) {
          __assert_fail("If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                        ,0x1c3,"void If_ManComputeRequired(If_Man_t *)");
        }
        for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
          pvVar2 = Vec_PtrEntry(p->vCos,iVar6);
          iVar1 = Vec_IntEntry(p->vCoAttrs,iVar6);
          if (iVar1 != -1) {
            iVar1 = Vec_IntEntry(p->vCoAttrs,iVar6);
            if (iVar1 == 0) {
              p_01 = p->pManTim;
              fVar11 = p->RequiredGlo;
            }
            else {
              iVar1 = Vec_IntEntry(p->vCoAttrs,iVar6);
              if (iVar1 == 1) {
                p_01 = p->pManTim;
                fVar11 = *(float *)(*(long *)((long)pvVar2 + 0x18) + 0x5c);
              }
              else {
                iVar1 = Vec_IntEntry(p->vCoAttrs,iVar6);
                if (iVar1 != 2) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                                ,0x1ce,"void If_ManComputeRequired(If_Man_t *)");
                }
                p_01 = p->pManTim;
                fVar11 = 1e+20;
              }
            }
            Tim_ManSetCoRequired(p_01,iVar6,fVar11);
          }
        }
      }
      for (uVar7 = 0; (int)uVar7 < p->vObjsRev->nSize; uVar7 = uVar7 + 1) {
        pIVar8 = (If_Obj_t *)(ulong)uVar7;
        puVar4 = (uint *)Vec_PtrEntry(p->vObjsRev,uVar7);
        switch(*puVar4 & 0xf) {
        case 1:
          break;
        case 2:
          Tim_ManSetCiRequired(p->pManTim,puVar4[2],(float)puVar4[0xd]);
          break;
        case 3:
          fVar13 = Tim_ManGetCoRequired(p->pManTim,puVar4[2]);
          fVar11 = *(float *)(*(long *)(puVar4 + 6) + 0x34);
          if (fVar11 <= fVar13) {
            fVar13 = fVar11;
          }
          *(float *)(*(long *)(puVar4 + 6) + 0x34) = fVar13;
          break;
        case 4:
          if (puVar4[3] != 0) {
            If_CutPropagateRequired(p,pIVar8,(If_Cut_t *)(puVar4 + 0x14),(float)puVar4[0xd]);
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTime.c"
                        ,0x202,"void If_ManComputeRequired(If_Man_t *)");
        }
      }
    }
  }
  return;
}

Assistant:

void If_ManComputeRequired( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter;
    float reqTime;

    // compute area, clean required times, collect nodes used in the mapping
//    p->AreaGlo = If_ManScanMapping( p );
    If_ManMarkMapping( p );
    if ( p->pManTim == NULL )
    {
        // consider the case when the required times are given
        if ( p->pPars->pTimesReq && !p->pPars->fAreaOnly )
        {
            // make sure that the required time hold
            Counter = 0;
            If_ManForEachCo( p, pObj, i )
            {
                if ( If_ObjArrTime(If_ObjFanin0(pObj)) > p->pPars->pTimesReq[i] + p->fEpsilon )
                {
                    If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                    Counter++;
    //                Abc_Print( 0, "Required times are violated for output %d (arr = %d; req = %d).\n", 
    //                    i, (int)If_ObjArrTime(If_ObjFanin0(pObj)), (int)p->pPars->pTimesReq[i] );
                }
                else
                    If_ObjFanin0(pObj)->Required = p->pPars->pTimesReq[i];
            }
            if ( Counter && !p->fReqTimeWarn )
            {
                Abc_Print( 0, "Required times are exceeded at %d output%s. The earliest arrival times are used.\n", Counter, Counter > 1 ? "s":"" );
                p->fReqTimeWarn = 1;
            }
        }
        else
        {
            // get the global required times
            p->RequiredGlo = If_ManDelayMax( p, 0 );

            // find new delay target
            if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
                p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

            // update the required times according to the target
            if ( p->pPars->DelayTarget != -1 )
            {
                if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
                        Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                    }
                }
                else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
                {
                    if ( p->fNextRound == 0 )
                    {
                        p->fNextRound = 1;
//                        Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                    }
                    p->RequiredGlo = p->pPars->DelayTarget;
                }
            }
            else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
                p->RequiredGlo = p->pPars->DelayTargetNew;
            // do not propagate required times if area minimization is requested
            if ( p->pPars->fAreaOnly ) 
                return;
            // set the required times for the POs
            if ( p->pPars->fDoAverage )
            {
                if ( p->pPars->nRelaxRatio )
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0;
                }
                else
                {
                    If_ManForEachCo( p, pObj, i )
                        If_ObjFanin0(pObj)->Required = If_ObjArrTime(If_ObjFanin0(pObj));
                }
            }
            else if ( p->pPars->fLatchPaths )
            {
                If_ManForEachLatchInput( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
            else 
            {
                If_ManForEachCo( p, pObj, i )
                    If_ObjFanin0(pObj)->Required = p->RequiredGlo;
            }
        }
        // go through the nodes in the reverse topological order
    //    Vec_PtrForEachEntry( If_Obj_t *, p->vMapped, pObj, i )
    //        If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( pObj->nRefs == 0 )
                continue;
            If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
        }
    }
    else
    {
        // get the global required times
        p->RequiredGlo = If_ManDelayMax( p, 0 );

        // find new delay target
        if ( p->pPars->nRelaxRatio && p->pPars->DelayTargetNew == 0 )
            p->pPars->DelayTargetNew = p->RequiredGlo * (100.0 + p->pPars->nRelaxRatio) / 100.0; 

        // update the required times according to the target
        if ( p->pPars->DelayTarget != -1 )
        {
            if ( p->RequiredGlo > p->pPars->DelayTarget + p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
                    Abc_Print( 0, "Cannot meet the target required times (%4.2f). Mapping continues anyway.\n", p->pPars->DelayTarget );
                }
            }
            else if ( p->RequiredGlo < p->pPars->DelayTarget - p->fEpsilon )
            {
                if ( p->fNextRound == 0 )
                {
                    p->fNextRound = 1;
//                    Abc_Print( 0, "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->RequiredGlo, p->pPars->DelayTarget );
                }
                p->RequiredGlo = p->pPars->DelayTarget;
            }
        }
        else if ( p->pPars->DelayTargetNew > 0 ) // relax the required times 
            p->RequiredGlo = p->pPars->DelayTargetNew;

        // do not propagate required times if area minimization is requested
        if ( p->pPars->fAreaOnly ) 
            return;
        // set the required times for the POs
        Tim_ManIncrementTravId( p->pManTim );
        if ( p->vCoAttrs )
        {
            assert( If_ManCoNum(p) == Vec_IntSize(p->vCoAttrs) );
            If_ManForEachCo( p, pObj, i )
            { 
                if ( Vec_IntEntry(p->vCoAttrs, i) == -1 )       // -1=internal
                    continue;
                if ( Vec_IntEntry(p->vCoAttrs, i) == 0 )        //  0=optimize
                    Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 1 )   //  1=keep
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
                else if ( Vec_IntEntry(p->vCoAttrs, i) == 2 )   //  2=relax
                    Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
                else assert( 0 );
            }
        }
        else if ( p->pPars->fDoAverage )
        {
            if ( p->pPars->nRelaxRatio )
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) * (100.0 + p->pPars->nRelaxRatio) / 100.0 );
            }
            else
            {
                If_ManForEachCo( p, pObj, i )
                    Tim_ManSetCoRequired( p->pManTim, i, If_ObjArrTime(If_ObjFanin0(pObj)) );
            }
        }
        else if ( p->pPars->fLatchPaths )
        {
            If_ManForEachPo( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, IF_FLOAT_LARGE );
            If_ManForEachLatchInput( p, pObj, i )
                Tim_ManSetCoRequired( p->pManTim, i, p->RequiredGlo );
        }
        else  
        {
            Tim_ManInitPoRequiredAll( p->pManTim, p->RequiredGlo );
//            If_ManForEachCo( p, pObj, i )
//                Tim_ManSetCoRequired( p->pManTim, pObj->IdPio, p->RequiredGlo );
        }
        // go through the nodes in the reverse topological order
        If_ManForEachObjReverse( p, pObj, i )
        {
            if ( If_ObjIsAnd(pObj) )
            {
                if ( pObj->nRefs == 0 )
                    continue;
                If_CutPropagateRequired( p, pObj, If_ObjCutBest(pObj), pObj->Required );
            }
            else if ( If_ObjIsCi(pObj) )
            {
                reqTime = pObj->Required;
                Tim_ManSetCiRequired( p->pManTim, pObj->IdPio, reqTime );
            }
            else if ( If_ObjIsCo(pObj) )
            {
                reqTime = Tim_ManGetCoRequired( p->pManTim, pObj->IdPio );
                If_ObjFanin0(pObj)->Required = IF_MIN( reqTime, If_ObjFanin0(pObj)->Required );
            }
            else if ( If_ObjIsConst1(pObj) )
            {
            }
            else // add the node to the mapper
                assert( 0 );
        }
    }
}